

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O0

void FIX::thread_detach(thread_id thread)

{
  pthread_t t;
  thread_id thread_local;
  
  pthread_detach(thread);
  return;
}

Assistant:

void thread_detach(thread_id thread) {
#ifdef _MSC_VER
  CloseHandle(thread);
#else
  pthread_t t = thread;
  pthread_detach(t);
#endif
}